

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

any __thiscall Json::init_right_of_pair(Json *this,string *s,size_t *start)

{
  char c;
  size_type sVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  undefined8 *puVar6;
  size_t *in_RCX;
  _Storage extraout_RDX;
  _Storage extraout_RDX_00;
  _Storage extraout_RDX_01;
  _Storage extraout_RDX_02;
  _Storage _Var7;
  _Storage extraout_RDX_03;
  long *plVar8;
  size_t current;
  bool bVar9;
  any aVar10;
  string str;
  JsonTools j;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [48];
  vector<std::any,_std::allocator<std::any>_> local_a0;
  size_t *local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_80;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  current = *in_RCX;
  *(undefined8 *)&(this->object)._M_t._M_impl = 0;
  *(undefined8 *)&(this->object)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  c = *(char *)(*start + current);
  local_88 = in_RCX;
  if (c == '{') {
    sVar5 = JsonTools::size_of_item((string *)start,current,'{','}');
    std::__cxx11::string::substr((ulong)local_d0,(ulong)start);
    std::__cxx11::string::operator=((string *)&local_f0,(string *)local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    Json((Json *)local_d0,&local_f0);
    std::any::operator=((any *)this,(Json *)local_d0);
  }
  else {
    if (c != '[') {
      if (c == '\"') {
        JsonTools::parse_string_literally((string *)local_d0,(string *)start,current + 1);
        std::__cxx11::string::operator=((string *)&local_f0,(string *)local_d0);
        if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
          operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
        }
        current = current + 1 + local_f0._M_string_length;
        std::any::operator=((any *)this,&local_f0);
        _Var7 = extraout_RDX;
      }
      else {
        bVar3 = JsonTools::is_digit(c);
        if (!bVar3) {
          JsonTools::JsonTools((JsonTools *)local_d0);
          if ((long *)local_d0._16_8_ != (long *)0x0) {
            bVar3 = false;
            plVar8 = (long *)local_d0._16_8_;
            do {
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
              ::pair(&local_80,
                     (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
                      *)(plVar8 + 1));
              std::__cxx11::string::substr((ulong)&local_50,(ulong)start);
              plVar2 = local_50;
              if (local_48 == local_80.first._M_string_length) {
                if (local_48 == 0) {
                  bVar9 = true;
                }
                else {
                  iVar4 = bcmp(local_50,local_80.first._M_dataplus._M_p,local_48);
                  bVar9 = iVar4 == 0;
                }
              }
              else {
                bVar9 = false;
              }
              if (plVar2 != local_40) {
                operator_delete(plVar2,local_40[0] + 1);
              }
              sVar1 = local_80.first._M_string_length;
              if (bVar9) {
                std::any::operator=((any *)this,&local_80.second);
                current = current + sVar1;
                bVar3 = true;
              }
              if (local_80.second._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
                (*local_80.second._M_manager)(_Op_destroy,&local_80.second,(_Arg *)0x0);
                local_80.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
                operator_delete(local_80.first._M_dataplus._M_p,
                                local_80.first.field_2._M_allocated_capacity + 1);
              }
            } while ((!bVar9) && (plVar8 = (long *)*plVar8, plVar8 != (long *)0x0));
            if (bVar3) {
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)local_d0);
              _Var7 = extraout_RDX_02;
              goto LAB_00109ea3;
            }
          }
          puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar6 = &PTR__exception_00112d20;
          puVar6[1] = "Unexpected symbol!";
          __cxa_throw(puVar6,&json_exception::JsonException::typeinfo,std::exception::~exception);
        }
        JsonTools::parse_number((string *)local_d0,(string *)start,*local_88);
        std::__cxx11::string::operator=((string *)&local_f0,(string *)local_d0);
        if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
          operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
        }
        sVar1 = local_f0._M_string_length;
        local_d0._0_8_ = atof(local_f0._M_dataplus._M_p);
        std::any::operator=((any *)this,(double *)local_d0);
        current = (current + sVar1) - 1;
        _Var7 = extraout_RDX_01;
      }
      goto LAB_00109ea3;
    }
    sVar5 = JsonTools::size_of_item((string *)start,current,'[',']');
    std::__cxx11::string::substr((ulong)local_d0,(ulong)start);
    std::__cxx11::string::operator=((string *)&local_f0,(string *)local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    Json((Json *)local_d0,&local_f0);
    std::any::operator=((any *)this,(Json *)local_d0);
  }
  std::vector<std::any,_std::allocator<std::any>_>::~vector(&local_a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
               *)local_d0);
  current = current + sVar5;
  _Var7 = extraout_RDX_00;
LAB_00109ea3:
  *local_88 = current;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
    _Var7 = extraout_RDX_03;
  }
  aVar10._M_storage._M_ptr = _Var7._M_ptr;
  aVar10._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)this;
  return aVar10;
}

Assistant:

any Json::init_right_of_pair(string& s, size_t& start) {
	size_t i = start;
	any value;
	string str;
	if (s[i] == '\"') {
		str = JsonTools::parse_string_literally(s, start + 1);
		i += str.size() + 1;
		value = str;
	} else if (s[i] == '[') {
		size_t end = JsonTools::size_of_item(s, i, '[', ']');
		str = s.substr(i, end);
		value = Json(str);
		i += end;
	} else if (s[i] == '{') {
		size_t end = JsonTools::size_of_item(s, i, '{', '}');
		str = s.substr(i, end);
		value = Json(str);
		i += end;
	} else if (JsonTools::is_digit(s[i])) {
		str = JsonTools::parse_number(s, start);
		i += str.size() - 1;
		value = atof(str.c_str());
	} else {
		bool gotit = false;
		JsonTools j;
		for (auto p : j.allowedLexems) {
			if (s.substr(i, p.first.length()) == p.first) {
				i += p.first.length();
				value = p.second;
				gotit = true;
				break;
			}
		}
		if (!gotit) throw json_exception::JsonException("Unexpected symbol!");
	}
	start = i;
	return value;
}